

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

void ect_train(ect *e,single_learner *base,example *ec)

{
  v_array<bool> *this;
  bool bVar1;
  size_t sVar2;
  single_learner *this_00;
  ulong uVar3;
  direction *pdVar4;
  uint32_t *puVar5;
  ostream *poVar6;
  bool *pbVar7;
  ulong uVar8;
  bool *pbVar9;
  uint uVar10;
  bool bVar11;
  uint32_t uVar12;
  bool local_57;
  bool local_56;
  bool local_55;
  float local_54;
  ulong local_50;
  uint local_44;
  single_learner *local_40;
  ulong local_38;
  
  if (e->k != 1) {
    uVar12 = (ec->l).multi.label;
    this = &e->tournaments_won;
    local_40 = base;
    v_array<bool>::clear(this);
    uVar10 = uVar12 - 1;
    pdVar4 = (e->directions)._begin;
    uVar3 = (ulong)pdVar4[uVar10].winner;
    bVar11 = pdVar4[uVar3].left == uVar10;
    do {
      this_00 = local_40;
      uVar12 = 0xbf800000;
      if (!bVar11) {
        uVar12 = 0x3f800000;
      }
      local_50 = CONCAT44(local_50._4_4_,uVar12);
      (ec->l).multi.label = uVar12;
      (ec->l).simple.initial = 0.0;
      LEARNER::learner<char,_example>::learn(local_40,ec,uVar3 - e->k);
      local_54 = ec->weight;
      ec->weight = 0.0;
      LEARNER::learner<char,_example>::learn(this_00,ec,uVar3 - e->k);
      ec->weight = local_54;
      pdVar4 = (e->directions)._begin;
      if (((ec->pred).scalar - e->class_boundary) * (float)local_50 <= 0.0) {
        if (pdVar4[uVar3].last == false) {
          bVar11 = pdVar4[pdVar4[uVar3].loser].left == (uint32_t)uVar3;
          if ((ulong)pdVar4[uVar3].loser == 0) {
            local_56 = false;
            pbVar7 = &local_56;
            goto LAB_00208670;
          }
        }
        else {
          local_57 = false;
          pbVar7 = &local_57;
LAB_00208670:
          v_array<bool>::push_back(this,pbVar7);
        }
        puVar5 = &(e->directions)._begin[uVar3].loser;
      }
      else {
        if (pdVar4[uVar3].last == false) {
          bVar11 = pdVar4[pdVar4[uVar3].winner].left == (uint32_t)uVar3;
        }
        else {
          local_55 = true;
          v_array<bool>::push_back(this,&local_55);
          pdVar4 = (e->directions)._begin;
        }
        puVar5 = &pdVar4[uVar3].winner;
      }
      uVar3 = (ulong)*puVar5;
    } while (*puVar5 != 0);
    if ((e->tournaments_won)._end == (e->tournaments_won)._begin) {
      poVar6 = std::operator<<((ostream *)&std::cout,"badness!");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    for (local_38 = 0; local_38 < e->tree_height; local_38 = local_38 + 1) {
      local_50 = ~local_38;
      local_54 = (float)((int)local_38 + 1);
      local_44 = ~(-1 << ((byte)local_38 & 0x1f));
      pbVar7 = (e->tournaments_won)._begin;
      pbVar9 = (e->tournaments_won)._end;
      uVar3 = 1;
      for (uVar10 = 0; uVar8 = (ulong)uVar10, uVar8 < (ulong)((long)pbVar9 - (long)pbVar7) >> 1;
          uVar10 = uVar10 + 1) {
        bVar11 = pbVar7[(int)uVar3 - 1];
        bVar1 = pbVar7[uVar3];
        if (bVar11 == bVar1) {
LAB_0020879d:
          pbVar7[uVar8] = bVar11;
        }
        else {
          uVar12 = 0xbf800000;
          if (bVar11 == false) {
            uVar12 = 0x3f800000;
          }
          sVar2 = e->tree_height;
          (ec->l).multi.label = uVar12;
          (ec->l).simple.weight = (float)(1 << ((char)(int)sVar2 + (char)local_50 & 0x1fU));
          (ec->l).simple.initial = 0.0;
          LEARNER::learner<char,_example>::learn
                    (local_40,ec,
                     (ulong)((uVar10 << (SUB41(local_54,0) & 0x1f)) + local_44 + e->last_pair));
          pbVar7 = (e->tournaments_won)._begin;
          if ((ec->pred).scalar < e->class_boundary || (ec->pred).scalar == e->class_boundary)
          goto LAB_0020879d;
          pbVar7[uVar8] = bVar1;
        }
        pbVar7 = (e->tournaments_won)._begin;
        uVar8 = (long)(e->tournaments_won)._end - (long)pbVar7;
        if ((uVar8 & 1) != 0) {
          pbVar7[uVar8 >> 1] = pbVar7[uVar8 - 1];
          pbVar7 = (e->tournaments_won)._begin;
          uVar8 = (long)(e->tournaments_won)._end - (long)pbVar7;
        }
        pbVar9 = pbVar7 + (uVar8 + 1 >> 1);
        (e->tournaments_won)._end = pbVar9;
        uVar3 = (ulong)((int)uVar3 + 2);
      }
    }
  }
  return;
}

Assistant:

void ect_train(ect& e, single_learner& base, example& ec)
{
  if (e.k == 1)  // nothing to do
    return;
  MULTICLASS::label_t mc = ec.l.multi;

  label_data simple_temp;

  simple_temp.initial = 0.;

  e.tournaments_won.clear();

  uint32_t id = e.directions[mc.label - 1].winner;
  bool left = e.directions[id].left == mc.label - 1;
  do
  {
    if (left)
      simple_temp.label = -1;
    else
      simple_temp.label = 1;

    ec.l.simple = simple_temp;
    base.learn(ec, id - e.k);
    float old_weight = ec.weight;
    ec.weight = 0.;
    base.learn(ec, id - e.k);  // inefficient, we should extract final prediction exactly.
    ec.weight = old_weight;

    bool won = (ec.pred.scalar - e.class_boundary) * simple_temp.label > 0;

    if (won)
    {
      if (!e.directions[id].last)
        left = e.directions[e.directions[id].winner].left == id;
      else
        e.tournaments_won.push_back(true);
      id = e.directions[id].winner;
    }
    else
    {
      if (!e.directions[id].last)
      {
        left = e.directions[e.directions[id].loser].left == id;
        if (e.directions[id].loser == 0)
          e.tournaments_won.push_back(false);
      }
      else
        e.tournaments_won.push_back(false);
      id = e.directions[id].loser;
    }
  } while (id != 0);

  if (e.tournaments_won.size() < 1)
    cout << "badness!" << endl;

  // tournaments_won is a bit vector determining which tournaments the label won.
  for (size_t i = 0; i < e.tree_height; i++)
  {
    for (uint32_t j = 0; j < e.tournaments_won.size() / 2; j++)
    {
      bool left = e.tournaments_won[j * 2];
      bool right = e.tournaments_won[j * 2 + 1];
      if (left == right)  // no query to do
        e.tournaments_won[j] = left;
      else  // query to do
      {
        if (left)
          simple_temp.label = -1;
        else
          simple_temp.label = 1;
        simple_temp.weight = (float)(1 << (e.tree_height - i - 1));
        ec.l.simple = simple_temp;

        uint32_t problem_number = e.last_pair + j * (1 << (i + 1)) + (1 << i) - 1;

        base.learn(ec, problem_number);

        if (ec.pred.scalar > e.class_boundary)
          e.tournaments_won[j] = right;
        else
          e.tournaments_won[j] = left;
      }
      if (e.tournaments_won.size() % 2 == 1)
        e.tournaments_won[e.tournaments_won.size() / 2] = e.tournaments_won[e.tournaments_won.size() - 1];
      e.tournaments_won.end() = e.tournaments_won.begin() + (1 + e.tournaments_won.size()) / 2;
    }
  }
}